

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O3

void uo_tcp_conn_after_close(uo_cb *cb)

{
  void *__ptr;
  
  __ptr = uo_cb_stack_index(cb,0);
  shutdown(*(int *)((long)__ptr + 0x60),2);
  close(*(int *)((long)__ptr + 0x60));
  uo_buf_free(*(uo_buf *)((long)__ptr + 0x40));
  uo_buf_free(*(uo_buf *)((long)__ptr + 0x48));
  free(*(void **)((long)__ptr + 0x28));
  free(__ptr);
  uo_cb_invoke(cb);
  return;
}

Assistant:

static void uo_tcp_conn_after_close(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_index(cb, 0);

    uo_tcp_conn_destroy(tcp_conn);
    uo_cb_invoke(cb);
}